

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type_conflict
time_plain<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
          (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
           *r)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  result_type_conflict rVar4;
  long lVar5;
  string res;
  string local_48;
  double local_28;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  sVar2 = r->i;
  rVar4 = 0;
  lVar5 = 0x1000000;
  do {
    if (sVar2 == 0x270) {
      boost::random::
      mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
      ::twist(r);
      sVar2 = r->i;
    }
    uVar3 = r->x[sVar2];
    sVar2 = sVar2 + 1;
    r->i = sVar2;
    uVar3 = uVar3 >> 0xb ^ uVar3;
    uVar3 = (uVar3 & 0x13a58ad) << 7 ^ uVar3;
    uVar3 = (uVar3 & 0x1df8c) << 0xf ^ uVar3;
    rVar4 = rVar4 + (uVar3 >> 0x12 ^ uVar3);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  lVar5 = std::chrono::_V2::system_clock::now();
  local_28 = 16.777216 / ((double)((lVar5 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_48,&local_28);
  while (local_48._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return rVar4;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}